

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O0

uint32_t __thiscall trackerboy::apu::Timer::fastforward(Timer *this,uint32_t cycles)

{
  uint uVar1;
  uint32_t clocks;
  uint32_t cycles_local;
  Timer *this_local;
  
  if (cycles < this->mCounter) {
    this->mCounter = this->mCounter - cycles;
    this_local._4_4_ = 0;
  }
  else {
    uVar1 = cycles - this->mCounter;
    this_local._4_4_ = uVar1 / this->mPeriod + 1;
    this->mCounter = this->mPeriod - uVar1 % this->mPeriod;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t Timer::fastforward(uint32_t cycles) noexcept {
    if (cycles < mCounter) {
        mCounter -= cycles;
        return 0;
    } else {
        cycles -= mCounter;
        auto clocks = (cycles / mPeriod) + 1;
        mCounter = mPeriod - (cycles % mPeriod);
        return clocks;
    }
}